

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_options.h
# Opt level: O3

void __thiscall google::protobuf::compiler::csharp::Options::~Options(Options *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->base_namespace)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->base_namespace).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->file_extension)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->file_extension).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Options() :
      file_extension(".cs"),
      base_namespace(""),
      base_namespace_specified(false),
      internal_access(false),
      serializable(false) {
  }